

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetInsertOneFanin(Wln_Ret_t *p,int iObj,int iFlop)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  Wln_Ntk_t *pWVar6;
  int iVar7;
  Wln_Vec_t *pWVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (-1 < iObj) {
    uVar1 = (p->vFanins).nSize;
    if (iObj < (int)uVar1) {
      piVar4 = (p->vFanins).pArray;
      lVar11 = (long)piVar4[(uint)iObj];
      if ((lVar11 < 0) || (uVar1 <= (uint)piVar4[(uint)iObj])) {
LAB_00365d6f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if ((-1 < iFlop) && (pWVar6 = p->pNtk, iFlop < (pWVar6->vTypes).nSize)) {
        if ((pWVar6->vTypes).pArray[(uint)iFlop] != 0x59) {
          __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                        ,0x1cd,"void Wln_RetInsertOneFanin(Wln_Ret_t *, int, int)");
        }
        pWVar8 = pWVar6->vFanins;
        if (0 < pWVar8[(uint)iObj].nSize) {
          lVar10 = 0;
          do {
            uVar1 = (p->vFanins).nSize;
            if ((int)uVar1 <= iObj) goto LAB_00365d50;
            piVar5 = (p->vFanins).pArray;
            uVar2 = piVar5[(uint)iObj];
            if (((long)(int)uVar2 < 0) || (uVar1 <= uVar2)) goto LAB_00365d6f;
            iVar3 = piVar5[(long)(int)uVar2 + lVar10 * 2];
            lVar9 = (long)iVar3;
            if (lVar9 != 0) {
              if (pWVar8[lVar9].nSize == 0) {
                if ((iVar3 < 0) || (iVar7 = (pWVar6->vTypes).nSize, iVar7 <= iVar3))
                goto LAB_00365d50;
                if ((pWVar6->vTypes).pArray[lVar9] != 3) goto LAB_00365d2c;
              }
              else {
                iVar7 = (pWVar6->vTypes).nSize;
              }
              if (iVar7 <= iObj) goto LAB_00365d50;
              if ((lVar10 == 0) || ((pWVar6->vTypes).pArray[(uint)iObj] != 0x59)) {
                iVar3 = piVar4[lVar11 + lVar10 * 2 + 1];
                piVar4[lVar11 + lVar10 * 2 + 1] = (p->vEdgeLinks).nSize;
                Vec_IntPush(&p->vEdgeLinks,iVar3);
                Vec_IntPush(&p->vEdgeLinks,iFlop);
                pWVar6 = p->pNtk;
              }
            }
LAB_00365d2c:
            lVar10 = lVar10 + 1;
            pWVar8 = pWVar6->vFanins;
          } while (lVar10 < pWVar8[(uint)iObj].nSize);
        }
        return;
      }
    }
  }
LAB_00365d50:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetInsertOneFanin( Wln_Ret_t * p, int iObj, int iFlop )
{
    int k, iHead, iFanin, * pLink;
    int * pFanins  = Wln_RetFanins( p, iObj );
    assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        iHead = pFanins[2*k+1];
        pFanins[2*k+1] = Vec_IntSize(&p->vEdgeLinks);
        Vec_IntPushTwo( &p->vEdgeLinks, iHead, iFlop );
    }
}